

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O2

uint32_t __thiscall
GmmLib::GmmResourceInfoCommon::GetPaddedWidth(GmmResourceInfoCommon *this,uint32_t MipLevel)

{
  GMM_TEXTURE_INFO *pGVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  undefined4 extraout_var;
  GMM_TEXTURE_CALC *this_00;
  uint32_t NumSamples;
  uint uVar5;
  
  iVar2 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
  this_00 = GmmGetTextureCalc((GMM_LIB_CONTEXT *)CONCAT44(extraout_var,iVar2));
  uVar3 = (*this_00->_vptr_GmmTextureCalc[0x18])(this_00,&this->Surf,(ulong)MipLevel);
  pGVar1 = &this->Surf;
  if ((~(ulong)(this->AuxSurf).Flags.Gpu & 0x20000000002) == 0) {
    pGVar1 = &this->AuxSurf;
  }
  if (((ulong)(this->Surf).Flags.Gpu & 0x20000040) == 0) {
    NumSamples = 1;
  }
  else {
    NumSamples = (this->Surf).MSAA.NumSamples;
  }
  uVar4 = GmmTextureCalc::ExpandWidth(this_00,uVar3,(pGVar1->Alignment).HAlign,NumSamples);
  if (((this->Surf).Flags.Gpu.field_0x3 & 0x20) != 0) {
    uVar4 = uVar4 << ((byte)((ulong)(this->Surf).Flags.Info >> 0x22) & 1);
    uVar5 = (this->Surf).MSAA.NumSamples - 2;
    uVar5 = uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f;
    if (uVar5 < 2) {
      uVar4 = uVar4 >> 1;
    }
    else if ((uVar5 == 3) || (uVar5 == 7)) {
      uVar4 = uVar4 >> 2;
    }
  }
  if ((~(ulong)(this->AuxSurf).Flags.Gpu & 0x20000000002) == 0) {
    uVar3 = (*this_00->_vptr_GmmTextureCalc[0x16])
                      (this_00,&this->AuxSurf,(ulong)uVar4,this_00->_vptr_GmmTextureCalc[0x16]);
    return uVar3;
  }
  return uVar4;
}

Assistant:

uint32_t GMM_STDCALL GmmLib::GmmResourceInfoCommon::GetPaddedWidth(uint32_t MipLevel)
{
    GMM_TEXTURE_CALC *pTextureCalc;
    uint32_t          AlignedWidth;
    GMM_GFX_SIZE_T    MipWidth;
    uint32_t          HAlign;

    __GMM_ASSERT(MipLevel <= Surf.MaxLod);

    pTextureCalc = GMM_OVERRIDE_TEXTURE_CALC(&Surf, GetGmmLibContext());

    // This shall be called for Depth and Separate Stencil main surface resource
    // This shall be called for the Aux surfaces (MCS, CCS and Hiz) too.
    // MCS will have Surf.Flags.Gpu.CCS set
    // Hiz will have Surf.Flags.Gpu.HiZ set
    __GMM_ASSERT(Surf.Flags.Gpu.Depth || Surf.Flags.Gpu.SeparateStencil ||
                 Surf.Flags.Gpu.CCS || Surf.Flags.Gpu.HiZ ||
                 AuxSurf.Flags.Gpu.__MsaaTileMcs ||
                 AuxSurf.Flags.Gpu.CCS || AuxSurf.Flags.Gpu.__NonMsaaTileYCcs);

    MipWidth = pTextureCalc->GmmTexGetMipWidth(&Surf, MipLevel);

    HAlign = Surf.Alignment.HAlign;
    if(AuxSurf.Flags.Gpu.CCS && AuxSurf.Flags.Gpu.__NonMsaaTileYCcs)
    {
        HAlign = AuxSurf.Alignment.HAlign;
    }

    AlignedWidth = __GMM_EXPAND_WIDTH(pTextureCalc,
                                      GFX_ULONG_CAST(MipWidth),
                                      HAlign,
                                      &Surf);

    if(Surf.Flags.Gpu.SeparateStencil)
    {
        if(Surf.Flags.Info.TiledW)
        {
            AlignedWidth *= 2;
        }

        // Reverse MSAA Expansion ////////////////////////////////////////////////
        // It might seem strange that we ExpandWidth (with consideration for MSAA)
        // only to "reverse" the MSAA portion of the expansion...It's an order-of-
        // operations thing--The intention of the reversal isn't to have
        // disregarded the original MSAA expansion but to produce a width, that
        // when MSAA'ed will match the true physical width (which requires MSAA
        // consideration to compute).
        switch(Surf.MSAA.NumSamples)
        {
            case 1:
                break;
            case 2: // Same as 4x...
            case 4:
                AlignedWidth /= 2;
                break;
            case 8: // Same as 16x...
            case 16:
                AlignedWidth /= 4;
                break;
            default:
                __GMM_ASSERT(0);
        }
    }

    // CCS Aux surface, Aligned width needs to be scaled based on main surface bpp
    if(AuxSurf.Flags.Gpu.CCS && AuxSurf.Flags.Gpu.__NonMsaaTileYCcs)
    {
        AlignedWidth = pTextureCalc->ScaleTextureWidth(&AuxSurf, AlignedWidth);
    }

    return AlignedWidth;
}